

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_deflate(uchar **out,size_t *outsize,uchar *in,size_t insize,
                    LodePNGCompressSettings *settings)

{
  ulong uVar1;
  int iVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  bool bVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  uint uVar11;
  uint uVar12;
  int *__s;
  int *piVar13;
  int *__s_00;
  uchar *puVar14;
  uint *puVar15;
  uint *puVar16;
  uint *frequencies;
  uint *puVar17;
  void *__dest;
  void *__ptr;
  ulong uVar18;
  unsigned_short uVar19;
  size_t sVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  uint *puVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  size_t sVar28;
  long lVar29;
  uint uVar30;
  size_t sVar31;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  size_t newsize;
  long lVar35;
  size_t sVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 in_ZMM5 [64];
  undefined1 auVar39 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar46 [32];
  ucvector v;
  LodePNGBitWriter local_200;
  ulong local_1f0;
  unsigned_short *local_1e8;
  uint local_1dc;
  HuffmanTree tree_ll;
  undefined1 local_1a8 [32];
  undefined1 local_188 [48];
  undefined1 local_158 [16];
  size_t local_148;
  undefined1 local_138 [16];
  void *local_120;
  unsigned_short *local_118;
  int *local_110;
  int *local_108;
  unsigned_short *local_100;
  HuffmanTree tree_d;
  Hash hash;
  undefined1 auVar45 [32];
  
  auVar39 = in_ZMM6._0_32_;
  auVar37 = in_ZMM5._0_16_;
  v.data = *out;
  v.size = *outsize;
  local_200.data = &v;
  local_200.bp = '\0';
  uVar30 = settings->btype;
  uVar11 = 0x3d;
  if (uVar30 < 3) {
    sVar28 = insize;
    v.allocsize = v.size;
    if (uVar30 != 1) {
      if (uVar30 == 0) {
        if (insize + 0xfffe < 0xffff) {
          uVar11 = 0;
        }
        else {
          uVar34 = (insize + 0xfffe) / 0xffff;
          uVar30 = 0;
          do {
            sVar28 = v.size;
            uVar11 = (int)insize - uVar30;
            if (0xfffe < insize - uVar30) {
              uVar11 = 0xffff;
            }
            uVar22 = (ulong)uVar11;
            uVar32 = uVar22 + v.size + 5;
            puVar14 = v.data;
            if (v.allocsize < uVar32) {
              sVar36 = (v.allocsize >> 1) + uVar32;
              puVar14 = (uchar *)realloc(v.data,sVar36);
              v.allocsize = sVar36;
              if (puVar14 == (uchar *)0x0) {
                uVar11 = 0x53;
                goto LAB_00127cf7;
              }
            }
            v.data = puVar14;
            v.data[sVar28] = uVar34 == 1;
            v.data[sVar28 + 1] = (uchar)uVar11;
            v.data[sVar28 + 2] = (uchar)(uVar11 >> 8);
            v.data[sVar28 + 3] = (uchar)(0xffff - uVar11);
            v.data[sVar28 + 4] = (uchar)(0xffff - uVar11 >> 8);
            v.size = uVar32;
            if (uVar22 != 0) {
              memcpy(v.data + sVar28 + 5,in + uVar30,uVar22);
            }
            uVar30 = uVar30 + uVar11;
            uVar34 = uVar34 - 1;
          } while (uVar34 != 0);
          uVar11 = 0;
        }
        goto LAB_00127cf7;
      }
      uVar34 = 0xfff8;
      if (0xfff8 < insize >> 3) {
        uVar34 = insize >> 3;
      }
      if (0x3fff7 < uVar34) {
        uVar34 = 0x3fff8;
      }
      sVar28 = uVar34 + 8;
    }
    uVar34 = 1;
    if (!CARRY8(insize - 1,sVar28)) {
      uVar34 = ((insize - 1) + sVar28) / sVar28;
    }
    uVar22 = (ulong)settings->windowsize;
    __s = (int *)malloc(0x40000);
    hash.head = __s;
    piVar13 = (int *)malloc(uVar22 * 4);
    sVar36 = uVar22 * 2;
    hash.val = piVar13;
    local_1e8 = (unsigned_short *)malloc(sVar36);
    hash.chain = local_1e8;
    local_100 = (unsigned_short *)malloc(sVar36);
    hash.zeros = local_100;
    __s_00 = (int *)malloc(0x40c);
    hash.headz = __s_00;
    local_118 = (unsigned_short *)malloc(sVar36);
    uVar11 = 0x53;
    local_110 = piVar13;
    local_108 = __s;
    hash.chainz = local_118;
    if (((((piVar13 != (int *)0x0) && (__s != (int *)0x0)) && (local_1e8 != (unsigned_short *)0x0))
        && ((local_100 != (unsigned_short *)0x0 && (__s_00 != (int *)0x0)))) &&
       (local_118 != (unsigned_short *)0x0)) {
      memset(__s,0xff,0x40000);
      if (uVar22 == 0) {
        memset(__s_00,0xff,0x40c);
      }
      else {
        memset(local_110,0xff,uVar22 * 4);
        lVar35 = uVar22 - 1;
        auVar44._8_8_ = lVar35;
        auVar44._0_8_ = lVar35;
        auVar45._16_8_ = lVar35;
        auVar45._0_16_ = auVar44;
        auVar45._24_8_ = lVar35;
        auVar38 = vpmovsxbq_avx2(ZEXT416(0xf0e0d0c));
        auVar4 = vpmovsxbq_avx2(ZEXT416(0xb0a0908));
        auVar5 = vpmovsxbq_avx2(ZEXT416(0x7060504));
        auVar6 = vpmovsxbq_avx2(ZEXT416(0x3020100));
        uVar32 = 0;
        local_138._8_8_ = 0x8000000000000000;
        local_138._0_8_ = 0x8000000000000000;
        auVar40 = auVar44 ^ local_138;
        auVar37 = vpcmpeqd_avx(auVar37,auVar37);
        auVar46._8_8_ = 0x8000000000000000;
        auVar46._0_8_ = 0x8000000000000000;
        auVar46._16_8_ = 0x8000000000000000;
        auVar46._24_8_ = 0x8000000000000000;
        auVar45 = auVar45 ^ auVar46;
        auVar39 = vpcmpeqd_avx2(auVar39,auVar39);
        local_1a8._8_8_ = 0x10;
        local_1a8._0_8_ = 0x10;
        local_1a8._16_8_ = 0x10;
        local_1a8._24_8_ = 0x10;
        do {
          auVar42 = vpcmpgtq_avx(local_138 ^ auVar6._0_16_,auVar40);
          auVar42 = vpackssdw_avx(auVar42,auVar42);
          auVar42 = vpackssdw_avx(auVar42 ^ auVar37,auVar42 ^ auVar37);
          auVar42 = vpacksswb_avx(auVar42,auVar42);
          uVar19 = (unsigned_short)uVar32;
          if ((auVar42 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_1e8[uVar32] = uVar19;
          }
          auVar42 = vpcmpgtq_avx(local_138 ^ auVar6._0_16_,auVar40);
          auVar42 = vpackssdw_avx(auVar42,auVar42);
          auVar42 = vpackssdw_avx(auVar42 ^ auVar37,auVar42 ^ auVar37);
          auVar42 = vpacksswb_avx(auVar42,auVar42);
          if ((auVar42 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_1e8[uVar32 + 1] = uVar19 + 1;
          }
          auVar3 = vpcmpgtq_avx2(auVar46 ^ auVar6,auVar45);
          auVar7 = vpshuflw_avx2(auVar3,0xe8);
          auVar42._0_4_ = auVar7._16_4_;
          auVar42._4_4_ = auVar42._0_4_;
          auVar42._8_4_ = auVar42._0_4_;
          auVar42._12_4_ = auVar42._0_4_;
          auVar42 = vpackssdw_avx(auVar42 ^ auVar37,auVar42 ^ auVar37);
          auVar42 = vpacksswb_avx(auVar42,auVar42);
          if ((auVar42 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_1e8[uVar32 + 2] = uVar19 + 2;
          }
          auVar42 = vpackssdw_avx(auVar3._16_16_,auVar3._16_16_);
          auVar42 = vpackssdw_avx(auVar42 ^ auVar37,auVar42 ^ auVar37);
          auVar42 = vpacksswb_avx(auVar42,auVar42);
          if ((auVar42 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_1e8[uVar32 + 3] = uVar19 + 3;
          }
          auVar42 = vpcmpgtq_avx(local_138 ^ auVar5._0_16_,auVar44 ^ local_138);
          auVar42 = vpackssdw_avx(auVar42,auVar42);
          auVar3 = vpermq_avx2(ZEXT1632(auVar42 ^ auVar37),0x55);
          auVar3 = vpackssdw_avx2(auVar3,auVar38);
          auVar42 = vpacksswb_avx(auVar3._16_16_,auVar3._16_16_);
          if ((auVar42 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_1e8[uVar32 + 4] = uVar19 + 4;
          }
          auVar42 = vpcmpgtq_avx(local_138 ^ auVar5._0_16_,auVar44 ^ local_138);
          auVar42 = vpshufhw_avx(auVar42,0x84);
          auVar3 = vpermq_avx2(ZEXT1632(auVar42 ^ auVar37),0x55);
          auVar3 = vpackssdw_avx2(auVar3,auVar38);
          auVar42 = vpacksswb_avx(auVar3._16_16_,auVar3._16_16_);
          if ((auVar42 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_1e8[uVar32 + 5] = uVar19 + 5;
          }
          auVar7 = vpcmpgtq_avx2(auVar46 ^ auVar5,auVar45);
          auVar3 = vpackssdw_avx2(auVar38,auVar7);
          auVar3 = vpackssdw_avx2(auVar3 ^ auVar39,auVar38);
          auVar42 = vpacksswb_avx(auVar3._16_16_,auVar3._16_16_);
          if ((auVar42 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_1e8[uVar32 + 6] = uVar19 + 6;
          }
          auVar3 = vpackssdw_avx2(auVar38,auVar7);
          auVar3 = vpackssdw_avx2(auVar3 ^ auVar39,auVar38);
          auVar42 = vpacksswb_avx(auVar3._16_16_,auVar3._16_16_);
          if ((auVar42 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_1e8[uVar32 + 7] = uVar19 + 7;
          }
          auVar42 = vpcmpgtq_avx(local_138 ^ auVar4._0_16_,auVar44 ^ local_138);
          auVar42 = vpackssdw_avx(auVar42,auVar42);
          auVar42 = vpackssdw_avx(auVar42 ^ auVar37,auVar42 ^ auVar37);
          auVar42 = vpacksswb_avx(auVar42,auVar42);
          if ((auVar42 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_1e8[uVar32 + 8] = uVar19 + 8;
          }
          auVar42 = vpcmpgtq_avx(local_138 ^ auVar4._0_16_,auVar44 ^ local_138);
          auVar42 = vpackssdw_avx(auVar42,auVar42);
          auVar42 = vpackssdw_avx(auVar42 ^ auVar37,auVar42 ^ auVar37);
          auVar42 = vpacksswb_avx(auVar42,auVar42);
          if ((auVar42 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_1e8[uVar32 + 9] = uVar19 + 9;
          }
          auVar3 = vpcmpgtq_avx2(auVar46 ^ auVar4,auVar45);
          auVar7 = vpshuflw_avx2(auVar3,0xe8);
          auVar43._0_4_ = auVar7._16_4_;
          auVar43._4_4_ = auVar43._0_4_;
          auVar43._8_4_ = auVar43._0_4_;
          auVar43._12_4_ = auVar43._0_4_;
          auVar42 = vpackssdw_avx(auVar43 ^ auVar37,auVar43 ^ auVar37);
          auVar42 = vpacksswb_avx(auVar42,auVar42);
          if ((auVar42 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_1e8[uVar32 + 10] = uVar19 + 10;
          }
          auVar42 = vpackssdw_avx(auVar3._16_16_,auVar3._16_16_);
          auVar42 = vpackssdw_avx(auVar42 ^ auVar37,auVar42 ^ auVar37);
          auVar42 = vpacksswb_avx(auVar42,auVar42);
          if ((auVar42 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_1e8[uVar32 + 0xb] = uVar19 + 0xb;
          }
          auVar42 = vpcmpgtq_avx(local_138 ^ auVar38._0_16_,auVar44 ^ local_138);
          auVar42 = vpackssdw_avx(auVar42,auVar42);
          auVar3 = vpermq_avx2(ZEXT1632(auVar42 ^ auVar37),0x55);
          auVar3 = vpackssdw_avx2(auVar38,auVar3);
          auVar42 = vpacksswb_avx(auVar3._16_16_,auVar3._16_16_);
          if ((auVar42 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_1e8[uVar32 + 0xc] = uVar19 + 0xc;
          }
          auVar42 = vpcmpgtq_avx(local_138 ^ auVar38._0_16_,auVar44 ^ local_138);
          auVar42 = vpshufhw_avx(auVar42,0x84);
          auVar3 = vpermq_avx2(ZEXT1632(auVar42 ^ auVar37),0x55);
          auVar3 = vpackssdw_avx2(auVar38,auVar3);
          auVar42 = vpacksswb_avx(auVar3._16_16_,auVar3._16_16_);
          if ((auVar42 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_1e8[uVar32 + 0xd] = uVar19 + 0xd;
          }
          auVar7 = vpcmpgtq_avx2(auVar46 ^ auVar38,auVar45);
          auVar3 = vpackssdw_avx2(auVar38,auVar7);
          auVar3 = vpackssdw_avx2(auVar38,auVar3 ^ auVar39);
          auVar42 = vpacksswb_avx(auVar3._16_16_,auVar3._16_16_);
          if ((auVar42 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_1e8[uVar32 + 0xe] = uVar19 + 0xe;
          }
          auVar3 = vpackssdw_avx2(auVar38,auVar7);
          auVar3 = vpackssdw_avx2(auVar38,auVar3 ^ auVar39);
          auVar42 = vpacksswb_avx(auVar3._16_16_,auVar3._16_16_);
          if ((auVar42 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_1e8[uVar32 + 0xf] = uVar19 + 0xf;
          }
          uVar32 = uVar32 + 0x10;
          auVar6 = vpaddq_avx2(local_1a8,auVar6);
          auVar5 = vpaddq_avx2(local_1a8,auVar5);
          auVar4 = vpaddq_avx2(local_1a8,auVar4);
          auVar38 = vpaddq_avx2(local_1a8,auVar38);
        } while ((uVar22 + 0xf & 0xfffffffffffffff0) != uVar32);
        auVar38 = ZEXT1632(auVar37);
        memset(__s_00,0xff,0x40c);
        auVar4 = vpmovsxbq_avx2(ZEXT416(0xf0e0d0c));
        auVar5 = vpmovsxbq_avx2(ZEXT416(0xb0a0908));
        auVar6 = vpmovsxbq_avx2(ZEXT416(0x7060504));
        auVar39 = vpmovsxbq_avx2(ZEXT416(0x3020100));
        uVar32 = 0;
        auVar37 = vpcmpeqd_avx(auVar40,auVar40);
        auVar38 = vpcmpeqd_avx2(auVar38,auVar38);
        do {
          auVar40 = vpcmpgtq_avx(local_138 ^ auVar39._0_16_,auVar44 ^ local_138);
          auVar40 = vpackssdw_avx(auVar40,auVar40);
          auVar40 = vpackssdw_avx(auVar40 ^ auVar37,auVar40 ^ auVar37);
          auVar40 = vpacksswb_avx(auVar40,auVar40);
          uVar19 = (unsigned_short)uVar32;
          if ((auVar40 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_118[uVar32] = uVar19;
          }
          auVar40 = vpcmpgtq_avx(local_138 ^ auVar39._0_16_,auVar44 ^ local_138);
          auVar40 = vpackssdw_avx(auVar40,auVar40);
          auVar40 = vpackssdw_avx(auVar40 ^ auVar37,auVar40 ^ auVar37);
          auVar40 = vpacksswb_avx(auVar40,auVar40);
          if ((auVar40 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_118[uVar32 + 1] = uVar19 + 1;
          }
          auVar3 = vpcmpgtq_avx2(auVar46 ^ auVar39,auVar45);
          auVar7 = vpshuflw_avx2(auVar3,0xe8);
          auVar40._0_4_ = auVar7._16_4_;
          auVar40._4_4_ = auVar40._0_4_;
          auVar40._8_4_ = auVar40._0_4_;
          auVar40._12_4_ = auVar40._0_4_;
          auVar40 = vpackssdw_avx(auVar40 ^ auVar37,auVar40 ^ auVar37);
          auVar40 = vpacksswb_avx(auVar40,auVar40);
          if ((auVar40 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_118[uVar32 + 2] = uVar19 + 2;
          }
          auVar40 = vpackssdw_avx(auVar3._16_16_,auVar3._16_16_);
          auVar40 = vpackssdw_avx(auVar40 ^ auVar37,auVar40 ^ auVar37);
          auVar40 = vpacksswb_avx(auVar40,auVar40);
          if ((auVar40 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_118[uVar32 + 3] = uVar19 + 3;
          }
          auVar40 = vpcmpgtq_avx(local_138 ^ auVar6._0_16_,auVar44 ^ local_138);
          auVar40 = vpackssdw_avx(auVar40,auVar40);
          auVar3 = vpermq_avx2(ZEXT1632(auVar40 ^ auVar37),0x55);
          auVar3 = vpackssdw_avx2(auVar3,auVar4);
          auVar40 = vpacksswb_avx(auVar3._16_16_,auVar3._16_16_);
          if ((auVar40 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_118[uVar32 + 4] = uVar19 + 4;
          }
          auVar40 = vpcmpgtq_avx(local_138 ^ auVar6._0_16_,auVar44 ^ local_138);
          auVar40 = vpshufhw_avx(auVar40,0x84);
          auVar3 = vpermq_avx2(ZEXT1632(auVar40 ^ auVar37),0x55);
          auVar3 = vpackssdw_avx2(auVar3,auVar4);
          auVar40 = vpacksswb_avx(auVar3._16_16_,auVar3._16_16_);
          if ((auVar40 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_118[uVar32 + 5] = uVar19 + 5;
          }
          auVar7 = vpcmpgtq_avx2(auVar46 ^ auVar6,auVar45);
          auVar3 = vpackssdw_avx2(auVar4,auVar7);
          auVar3 = vpackssdw_avx2(auVar3 ^ auVar38,auVar4);
          auVar40 = vpacksswb_avx(auVar3._16_16_,auVar3._16_16_);
          if ((auVar40 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_118[uVar32 + 6] = uVar19 + 6;
          }
          auVar3 = vpackssdw_avx2(auVar4,auVar7);
          auVar3 = vpackssdw_avx2(auVar3 ^ auVar38,auVar4);
          auVar40 = vpacksswb_avx(auVar3._16_16_,auVar3._16_16_);
          if ((auVar40 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_118[uVar32 + 7] = uVar19 + 7;
          }
          auVar40 = vpcmpgtq_avx(local_138 ^ auVar5._0_16_,auVar44 ^ local_138);
          auVar40 = vpackssdw_avx(auVar40,auVar40);
          auVar40 = vpackssdw_avx(auVar40 ^ auVar37,auVar40 ^ auVar37);
          auVar40 = vpacksswb_avx(auVar40,auVar40);
          if ((auVar40 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_118[uVar32 + 8] = uVar19 + 8;
          }
          auVar40 = vpcmpgtq_avx(local_138 ^ auVar5._0_16_,auVar44 ^ local_138);
          auVar40 = vpackssdw_avx(auVar40,auVar40);
          auVar40 = vpackssdw_avx(auVar40 ^ auVar37,auVar40 ^ auVar37);
          auVar40 = vpacksswb_avx(auVar40,auVar40);
          if ((auVar40 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_118[uVar32 + 9] = uVar19 + 9;
          }
          auVar3 = vpcmpgtq_avx2(auVar46 ^ auVar5,auVar45);
          auVar7 = vpshuflw_avx2(auVar3,0xe8);
          auVar41._0_4_ = auVar7._16_4_;
          auVar41._4_4_ = auVar41._0_4_;
          auVar41._8_4_ = auVar41._0_4_;
          auVar41._12_4_ = auVar41._0_4_;
          auVar40 = vpackssdw_avx(auVar41 ^ auVar37,auVar41 ^ auVar37);
          auVar40 = vpacksswb_avx(auVar40,auVar40);
          if ((auVar40 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_118[uVar32 + 10] = uVar19 + 10;
          }
          auVar40 = vpackssdw_avx(auVar3._16_16_,auVar3._16_16_);
          auVar40 = vpackssdw_avx(auVar40 ^ auVar37,auVar40 ^ auVar37);
          auVar40 = vpacksswb_avx(auVar40,auVar40);
          if ((auVar40 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_118[uVar32 + 0xb] = uVar19 + 0xb;
          }
          auVar40 = vpcmpgtq_avx(local_138 ^ auVar4._0_16_,auVar44 ^ local_138);
          auVar40 = vpackssdw_avx(auVar40,auVar40);
          auVar3 = vpermq_avx2(ZEXT1632(auVar40 ^ auVar37),0x55);
          auVar3 = vpackssdw_avx2(auVar4,auVar3);
          auVar40 = vpacksswb_avx(auVar3._16_16_,auVar3._16_16_);
          if ((auVar40 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_118[uVar32 + 0xc] = uVar19 + 0xc;
          }
          auVar40 = vpcmpgtq_avx(local_138 ^ auVar4._0_16_,auVar44 ^ local_138);
          auVar40 = vpshufhw_avx(auVar40,0x84);
          auVar3 = vpermq_avx2(ZEXT1632(auVar40 ^ auVar37),0x55);
          auVar3 = vpackssdw_avx2(auVar4,auVar3);
          auVar40 = vpacksswb_avx(auVar3._16_16_,auVar3._16_16_);
          if ((auVar40 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_118[uVar32 + 0xd] = uVar19 + 0xd;
          }
          auVar7 = vpcmpgtq_avx2(auVar46 ^ auVar4,auVar45);
          auVar3 = vpackssdw_avx2(auVar4,auVar7);
          auVar3 = vpackssdw_avx2(auVar4,auVar3 ^ auVar38);
          auVar40 = vpacksswb_avx(auVar3._16_16_,auVar3._16_16_);
          if ((auVar40 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_118[uVar32 + 0xe] = uVar19 + 0xe;
          }
          auVar3 = vpackssdw_avx2(auVar4,auVar7);
          auVar3 = vpackssdw_avx2(auVar4,auVar3 ^ auVar38);
          auVar40 = vpacksswb_avx(auVar3._16_16_,auVar3._16_16_);
          if ((auVar40 & (undefined1  [16])0x100000000000000) != (undefined1  [16])0x0) {
            local_118[uVar32 + 0xf] = uVar19 + 0xf;
          }
          uVar32 = uVar32 + 0x10;
          auVar39 = vpaddq_avx2(local_1a8,auVar39);
          auVar6 = vpaddq_avx2(local_1a8,auVar6);
          auVar5 = vpaddq_avx2(local_1a8,auVar5);
          auVar4 = vpaddq_avx2(local_1a8,auVar4);
        } while ((uVar22 + 0xf & 0x1fffffff0) != uVar32);
      }
      if (uVar34 == 0) {
        uVar11 = 0;
      }
      else {
        lVar35 = 0;
        uVar32 = 0;
        puVar14 = in;
        uVar22 = sVar28;
        do {
          auVar39 = local_1a8;
          uVar26 = uVar22;
          if (insize < uVar22) {
            uVar26 = insize;
          }
          uVar25 = uVar32 * sVar28;
          uVar18 = sVar28 + uVar25;
          if (insize <= sVar28 + uVar25) {
            uVar18 = insize;
          }
          uVar30 = (uint)(uVar32 == uVar34 - 1);
          if (settings->btype == 2) {
            local_138._0_8_ = lVar35;
            local_158 = (undefined1  [16])0x0;
            local_148 = 0;
            tree_ll.codes = (uint *)0x0;
            tree_ll.lengths = (uint *)0x0;
            tree_ll.table_len = (uchar *)0x0;
            tree_ll.table_value = (unsigned_short *)0x0;
            tree_d.codes = (uint *)0x0;
            tree_d.lengths = (uint *)0x0;
            tree_d.table_len = (uchar *)0x0;
            tree_d.table_value = (unsigned_short *)0x0;
            local_188._0_16_ = (undefined1  [16])0x0;
            local_188._24_16_ = (undefined1  [16])0x0;
            local_1dc = uVar30;
            puVar15 = (uint *)malloc(0x478);
            puVar16 = (uint *)malloc(0x78);
            frequencies = (uint *)malloc(0x4c);
            local_1a8._0_4_ = 0x53;
            if (frequencies == (uint *)0x0 || (puVar16 == (uint *)0x0 || puVar15 == (uint *)0x0)) {
LAB_001276d7:
              __ptr = (void *)0x0;
              __dest = (void *)0x0;
            }
            else {
              memset(puVar15,0,0x478);
              puVar16[0] = 0;
              puVar16[1] = 0;
              puVar16[2] = 0;
              puVar16[3] = 0;
              puVar16[4] = 0;
              puVar16[5] = 0;
              puVar16[6] = 0;
              puVar16[7] = 0;
              puVar16[8] = 0;
              puVar16[9] = 0;
              puVar16[10] = 0;
              puVar16[0xb] = 0;
              puVar16[0xc] = 0;
              puVar16[0xd] = 0;
              puVar16[0xe] = 0;
              puVar16[0xf] = 0;
              puVar16[0x10] = 0;
              puVar16[0x11] = 0;
              puVar16[0x12] = 0;
              puVar16[0x13] = 0;
              puVar16[0x14] = 0;
              puVar16[0x15] = 0;
              puVar16[0x16] = 0;
              puVar16[0x17] = 0;
              puVar16[0x16] = 0;
              puVar16[0x17] = 0;
              puVar16[0x18] = 0;
              puVar16[0x19] = 0;
              puVar16[0x1a] = 0;
              puVar16[0x1b] = 0;
              puVar16[0x1c] = 0;
              puVar16[0x1d] = 0;
              frequencies[0xb] = 0;
              frequencies[0xc] = 0;
              frequencies[0xd] = 0;
              frequencies[0xe] = 0;
              frequencies[0xf] = 0;
              frequencies[0x10] = 0;
              frequencies[0x11] = 0;
              frequencies[0x12] = 0;
              frequencies[8] = 0;
              frequencies[9] = 0;
              frequencies[10] = 0;
              frequencies[0xb] = 0;
              frequencies[0xc] = 0;
              frequencies[0xd] = 0;
              frequencies[0xe] = 0;
              frequencies[0xf] = 0;
              frequencies[0] = 0;
              frequencies[1] = 0;
              frequencies[2] = 0;
              frequencies[3] = 0;
              frequencies[4] = 0;
              frequencies[5] = 0;
              frequencies[6] = 0;
              frequencies[7] = 0;
              if (settings->use_lz77 == 0) {
                sVar31 = uVar18 - uVar25;
                sVar36 = sVar31 * 4;
                if (sVar36 == 0) {
                  puVar17 = (uint *)0x0;
                  sVar36 = local_148;
                  puVar24 = (uint *)local_158._0_8_;
                }
                else {
                  puVar17 = (uint *)malloc(sVar36);
                  puVar24 = puVar17;
                  if (puVar17 == (uint *)0x0) goto LAB_001276d7;
                }
                local_158._0_8_ = puVar24;
                local_148 = sVar36;
                local_158._8_8_ = sVar31;
                if (uVar25 < uVar18) {
                  lVar23 = 0;
                  do {
                    puVar17[lVar23] = (uint)puVar14[lVar23];
                    lVar23 = lVar23 + 1;
                  } while (uVar26 + lVar35 != lVar23);
                }
LAB_001275c1:
                if (sVar31 != 0) {
                  sVar20 = 0;
                  do {
                    uVar30 = *(uint *)(local_158._0_8_ + sVar20 * 4);
                    puVar15[uVar30] = puVar15[uVar30] + 1;
                    if (0x100 < (ulong)uVar30) {
                      puVar16[*(uint *)(local_158._0_8_ + (sVar20 + 2) * 4)] =
                           puVar16[*(uint *)(local_158._0_8_ + (sVar20 + 2) * 4)] + 1;
                      sVar20 = sVar20 + 3;
                    }
                    sVar20 = sVar20 + 1;
                  } while (sVar20 != sVar31);
                }
                puVar15[0x100] = 1;
                uVar30 = HuffmanTree_makeFromFrequencies(&tree_ll,puVar15,0x101,0x11e,0xf);
                if (uVar30 != 0) {
                  local_1a8._0_4_ = uVar30;
                  goto LAB_001276d7;
                }
                uVar12 = HuffmanTree_makeFromFrequencies(&tree_d,puVar16,2,0x1e,0xf);
                uVar11 = tree_d.numcodes;
                uVar30 = tree_ll.numcodes;
                if (uVar12 == 0) {
                  local_1f0 = 0x11e;
                  if (tree_ll.numcodes < 0x11e) {
                    local_1f0 = (ulong)tree_ll.numcodes;
                  }
                  uVar26 = 0x1e;
                  if (tree_d.numcodes < 0x1e) {
                    uVar26 = (ulong)tree_d.numcodes;
                  }
                  uVar18 = local_1f0 + uVar26;
                  uVar25 = (ulong)(uint)((int)uVar18 * 4);
                  __dest = malloc(uVar25);
                  __ptr = malloc(uVar25);
                  if (__ptr != (void *)0x0 && __dest != (void *)0x0) {
                    if (uVar30 != 0) {
                      memcpy(__dest,tree_ll.lengths,local_1f0 * 4);
                    }
                    if (uVar11 != 0) {
                      memcpy((void *)((long)__dest + local_1f0 * 4),tree_d.lengths,uVar26 * 4);
                    }
                    bVar8 = true;
                    if (uVar18 == 0) {
LAB_00127a78:
                      lVar23 = 0;
                    }
                    else {
                      local_1a8._8_24_ = auVar39._8_24_;
                      local_1a8._0_8_ = (long)__ptr + 8;
                      uVar25 = 0;
                      lVar35 = 0;
                      do {
                        uVar1 = uVar25 + 1;
                        iVar2 = *(int *)((long)__dest + uVar25 * 4);
                        if (uVar1 < uVar18) {
                          uVar21 = 0;
                          uVar27 = uVar1;
                          do {
                            if (*(int *)((long)__dest + uVar27 * 4) != iVar2) break;
                            uVar21 = (ulong)((int)uVar21 + 1);
                            uVar27 = uVar1 + uVar21;
                          } while (uVar27 < uVar18);
                          uVar30 = (uint)uVar21;
                          if (uVar30 < 2 || iVar2 != 0) {
                            if (uVar30 < 3) goto LAB_00127970;
                            *(int *)((long)__ptr + lVar35 * 4) = iVar2;
                            lVar23 = lVar35 + 1;
                            if (5 < uVar30) {
                              lVar33 = (long)__ptr + 8 + lVar35 * 4;
                              lVar29 = 0;
                              do {
                                *(undefined8 *)(lVar33 + -4) = 0x300000010;
                                lVar33 = lVar33 + 8;
                                lVar29 = lVar29 + -2;
                              } while ((ulong)(uint)((int)(uVar21 / 6) * 2) + lVar29 != 0);
                              lVar23 = lVar23 - lVar29;
                              lVar35 = lVar35 - lVar29;
                            }
                            uVar11 = uVar30 + (int)(uVar21 / 6) * -6;
                            if (uVar11 < 3) {
                              uVar30 = uVar30 - uVar11;
                            }
                            else {
                              *(undefined4 *)((long)__ptr + lVar23 * 4) = 0x10;
                              *(uint *)((long)__ptr + lVar35 * 4 + 8) = uVar11 - 3;
                              lVar23 = lVar35 + 3;
                            }
                          }
                          else {
                            uVar11 = uVar30 + 1;
                            if (uVar11 < 0xb) {
                              *(undefined4 *)((long)__ptr + lVar35 * 4) = 0x11;
                              *(uint *)((long)__ptr + lVar35 * 4 + 4) = uVar30 - 2;
                            }
                            else {
                              if (0x89 < uVar11) {
                                uVar11 = 0x8a;
                              }
                              *(undefined4 *)((long)__ptr + lVar35 * 4) = 0x12;
                              *(uint *)((long)__ptr + lVar35 * 4 + 4) = uVar11 - 0xb;
                              uVar30 = uVar11 - 1;
                            }
                            lVar23 = lVar35 + 2;
                          }
                          uVar25 = uVar25 + uVar30;
                        }
                        else {
LAB_00127970:
                          *(int *)((long)__ptr + lVar35 * 4) = iVar2;
                          lVar23 = lVar35 + 1;
                        }
                        uVar25 = uVar25 + 1;
                        lVar35 = lVar23;
                      } while (uVar25 != uVar18);
                      if (lVar23 == 0) goto LAB_00127a78;
                      lVar35 = 0;
                      do {
                        uVar18 = (ulong)*(uint *)((long)__ptr + lVar35 * 4);
                        frequencies[uVar18] = frequencies[uVar18] + 1;
                        lVar35 = (lVar35 - (ulong)(uVar18 < 0x10)) + 2;
                      } while (lVar35 != lVar23);
                      bVar8 = false;
                    }
                    local_1a8._0_4_ =
                         HuffmanTree_makeFromFrequencies
                                   ((HuffmanTree *)local_188,frequencies,0x13,0x13,7);
                    if (local_1a8._0_4_ == 0) {
                      uVar10 = local_188._8_8_;
                      uVar18 = 0x14;
                      lVar35 = 0x13;
                      do {
                        lVar33 = lVar35;
                        uVar25 = uVar18 - 1;
                        if (uVar25 < 5) {
                          uVar25 = 4;
                          break;
                        }
                        lVar29 = uVar18 * 4;
                        uVar18 = uVar25;
                        lVar35 = lVar33 + -1;
                      } while (*(uint *)(local_188._8_8_ +
                                        (ulong)*(uint *)(&UNK_001e5038 + lVar29) * 4) == 0);
                      local_120 = __dest;
                      writeBits(&local_200,local_1dc,1);
                      writeBits(&local_200,0,1);
                      writeBits(&local_200,1,1);
                      writeBits(&local_200,(int)local_1f0 - 0x101,5);
                      writeBits(&local_200,(int)uVar26 - 1,5);
                      writeBits(&local_200,(int)uVar25 - 4,4);
                      puVar24 = CLCL_ORDER;
                      do {
                        writeBits(&local_200,*(uint *)(uVar10 + (ulong)*puVar24 * 4),3);
                        puVar24 = puVar24 + 1;
                        lVar33 = lVar33 + -1;
                      } while (lVar33 != 0);
                      if (!bVar8) {
                        uVar9 = local_188._0_8_;
                        local_1a8._0_8_ = local_188._0_8_;
                        lVar35 = 0;
                        do {
                          uVar30 = *(uint *)((long)__ptr + lVar35 * 4);
                          writeBitsReversed(&local_200,*(uint *)(uVar9 + (ulong)uVar30 * 4),
                                            (ulong)*(uint *)(uVar10 + (ulong)uVar30 * 4));
                          if (uVar30 - 0x10 < 3) {
                            lVar33 = lVar35 * 4;
                            lVar35 = lVar35 + 1;
                            writeBits(&local_200,*(uint *)((long)__ptr + lVar33 + 4),
                                      *(size_t *)(&DAT_001e5110 + (ulong)(uVar30 - 0x10) * 8));
                          }
                          lVar35 = lVar35 + 1;
                        } while (lVar35 != lVar23);
                      }
                      writeLZ77data(&local_200,(uivector *)local_158,&tree_ll,&tree_d);
                      if ((ulong)tree_ll.lengths[0x100] == 0) {
                        local_1a8._0_4_ = 0x40;
                        __dest = local_120;
                      }
                      else {
                        writeBitsReversed(&local_200,tree_ll.codes[0x100],
                                          (ulong)tree_ll.lengths[0x100]);
                        auVar39._28_4_ = 0;
                        auVar39._0_28_ = local_1a8._4_28_;
                        local_1a8 = auVar39 << 0x20;
                        __dest = local_120;
                      }
                    }
                  }
                }
                else {
                  __ptr = (void *)0x0;
                  local_1a8._0_4_ = uVar12;
                  __dest = (void *)0x0;
                }
              }
              else {
                uVar30 = encodeLZ77((uivector *)local_158,&hash,in,uVar25,uVar18,
                                    settings->windowsize,settings->minmatch,settings->nicematch,
                                    settings->lazymatching);
                if (uVar30 == 0) {
                  sVar31 = local_158._8_8_;
                  goto LAB_001275c1;
                }
                __ptr = (void *)0x0;
                local_1a8._0_4_ = uVar30;
                __dest = (void *)0x0;
              }
            }
            free((void *)local_158._0_8_);
            HuffmanTree_cleanup(&tree_ll);
            HuffmanTree_cleanup(&tree_d);
            HuffmanTree_cleanup((HuffmanTree *)local_188);
            free(puVar15);
            free(puVar16);
            free(frequencies);
            free(__dest);
            free(__ptr);
            lVar35 = local_138._0_8_;
            uVar11 = local_1a8._0_4_;
          }
          else {
            uVar11 = 0;
            if (settings->btype == 1) {
              local_138._0_8_ = lVar35;
              tree_ll.codes = (uint *)0x0;
              tree_ll.lengths = (uint *)0x0;
              tree_ll.table_len = (uchar *)0x0;
              tree_ll.table_value = (unsigned_short *)0x0;
              tree_d.codes = (uint *)0x0;
              tree_d.lengths = (uint *)0x0;
              tree_d.table_len = (uchar *)0x0;
              tree_d.table_value = (unsigned_short *)0x0;
              uVar11 = generateFixedLitLenTree(&tree_ll);
              if ((uVar11 == 0) && (uVar11 = generateFixedDistanceTree(&tree_d), uVar11 == 0)) {
                writeBits(&local_200,uVar30,1);
                writeBits(&local_200,1,1);
                writeBits(&local_200,0,1);
                if (settings->use_lz77 == 0) {
                  puVar15 = tree_ll.codes;
                  puVar16 = tree_ll.lengths;
                  if (uVar25 < uVar18) {
                    lVar23 = 0;
                    do {
                      writeBitsReversed(&local_200,puVar15[puVar14[lVar23]],
                                        (ulong)puVar16[puVar14[lVar23]]);
                      lVar23 = lVar23 + 1;
                    } while (uVar26 + lVar35 != lVar23);
                  }
                }
                else {
                  local_188._0_16_ = (undefined1  [16])0x0;
                  local_188._16_8_ = 0;
                  uVar11 = encodeLZ77((uivector *)local_188,&hash,in,uVar25,uVar18,
                                      settings->windowsize,settings->minmatch,settings->nicematch,
                                      settings->lazymatching);
                  if (uVar11 != 0) {
                    free((void *)local_188._0_8_);
                    goto LAB_0012727e;
                  }
                  writeLZ77data(&local_200,(uivector *)local_188,&tree_ll,&tree_d);
                  free((void *)local_188._0_8_);
                  puVar16 = tree_ll.lengths;
                  puVar15 = tree_ll.codes;
                }
                writeBitsReversed(&local_200,puVar15[0x100],(ulong)puVar16[0x100]);
                uVar11 = 0;
              }
LAB_0012727e:
              HuffmanTree_cleanup(&tree_ll);
              HuffmanTree_cleanup(&tree_d);
              lVar35 = local_138._0_8_;
            }
          }
          uVar32 = uVar32 + 1;
          if (uVar32 == uVar34) break;
          uVar22 = uVar22 + sVar28;
          lVar35 = lVar35 - sVar28;
          puVar14 = puVar14 + sVar28;
        } while (uVar11 == 0);
      }
    }
    free(local_108);
    free(local_110);
    free(local_1e8);
    free(local_100);
    free(__s_00);
    free(local_118);
  }
LAB_00127cf7:
  *out = v.data;
  *outsize = v.size;
  return uVar11;
}

Assistant:

unsigned lodepng_deflate(unsigned char** out, size_t* outsize,
  const unsigned char* in, size_t insize,
  const LodePNGCompressSettings* settings) {
  ucvector v = ucvector_init(*out, *outsize);
  unsigned error = lodepng_deflatev(&v, in, insize, settings);
  *out = v.data;
  *outsize = v.size;
  return error;
}